

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O3

void __thiscall baryonyx::pnm_array::operator()(pnm_array *this,string *filename)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  ofstream ofs;
  string local_258;
  ulong local_238 [2];
  ulong local_228;
  undefined8 local_218;
  long local_208;
  filebuf local_200 [240];
  ios_base local_110 [264];
  
  std::ofstream::ofstream(&local_208,(string *)filename,_S_bin);
  local_238[0] = (ulong)this->m_width;
  local_228 = (ulong)this->m_heigth;
  local_218 = 0xff;
  format_str.size_ = 0x122;
  format_str.data_ = (char *)0xc;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_238;
  fmt::v7::detail::vformat_abi_cxx11_(&local_258,(detail *)"P6 {} {} {} ",format_str,args);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::ostream::write((char *)&local_208,
                      (long)(this->m_buffer)._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_208 = _VTT;
  *(undefined8 *)(local_200 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_200);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void operator()(std::string filename) const noexcept
    {
        std::ofstream ofs{ filename, std::ios::binary };
        auto header{ fmt::format("P6 {} {} {} ", m_width, m_heigth, 255) };

        ofs << header;
        ofs.write(reinterpret_cast<char*>(m_buffer.get()), size());
    }